

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

double __thiscall Quat4f::log(Quat4f *this,double __x)

{
  undefined8 uVar1;
  float *in_RSI;
  double dVar2;
  undefined1 auVar3 [16];
  float fVar4;
  
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(in_RSI[2] * in_RSI[2])),ZEXT416((uint)in_RSI[1]),
                           ZEXT416((uint)in_RSI[1]));
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)in_RSI[3]),ZEXT416((uint)in_RSI[3]),auVar3);
  if (auVar3._0_4_ < 0.0) {
    fVar4 = sqrtf(auVar3._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar4 = auVar3._0_4_;
  }
  if (1e-06 <= (double)fVar4) {
    dVar2 = acos((double)*in_RSI);
    fVar4 = (float)(dVar2 / (double)fVar4);
    auVar3._0_4_ = (float)*(undefined8 *)(in_RSI + 1) * fVar4;
    auVar3._4_4_ = (float)((ulong)*(undefined8 *)(in_RSI + 1) >> 0x20) * fVar4;
    auVar3._8_4_ = fVar4 * 0.0;
    auVar3._12_4_ = fVar4 * 0.0;
    fVar4 = fVar4 * in_RSI[3];
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(in_RSI + 1);
    fVar4 = in_RSI[3];
  }
  this->m_elements[0] = 0.0;
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(this->m_elements + 1) = uVar1;
  this->m_elements[3] = fVar4;
  return auVar3._0_8_;
}

Assistant:

Quat4f Quat4f::log() const
{
	float len =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( len < 1e-6 )
	{
		return Quat4f( 0, m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = acos( m_elements[ 0 ] ) / len;
		return Quat4f( 0, m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );
	}
}